

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

Gia_Man_t * Gia_ManReduceConst(Gia_Man_t *pAig,int fVerbose)

{
  Gia_ManTer_t *p_00;
  int *pCi2Lit_00;
  Gia_Man_t *pGVar1;
  int *pCi2Lit;
  Gia_Man_t *pNew;
  Gia_ManTer_t *p;
  int fVerbose_local;
  Gia_Man_t *pAig_local;
  
  p_00 = Gia_ManTerSimulate(pAig,fVerbose);
  Gia_ManTerAnalyze(p_00);
  pCi2Lit_00 = Gia_ManTerCreateMap(p_00,fVerbose);
  Gia_ManTerDelete(p_00);
  pGVar1 = Gia_ManDupDfsCiMap(pAig,pCi2Lit_00,(Vec_Int_t *)0x0);
  if (pCi2Lit_00 != (int *)0x0) {
    free(pCi2Lit_00);
  }
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManReduceConst( Gia_Man_t * pAig, int fVerbose )
{
    Gia_ManTer_t * p;
    Gia_Man_t * pNew = NULL;
    int * pCi2Lit;
    p = Gia_ManTerSimulate( pAig, fVerbose );
    Gia_ManTerAnalyze( p );
    pCi2Lit = Gia_ManTerCreateMap( p, fVerbose );
    Gia_ManTerDelete( p );
    pNew = Gia_ManDupDfsCiMap( pAig, pCi2Lit, NULL );
    ABC_FREE( pCi2Lit );
    return pNew;
}